

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http(Curl_easy *data,_Bool *done)

{
  size_t sVar1;
  char *pcVar2;
  bool bVar3;
  char *local_188;
  char *local_160;
  char *local_150;
  char *local_140;
  char *local_130;
  char *local_120;
  char *local_110;
  char *local_100;
  char *local_f0;
  char *local_e0;
  char *local_d0;
  char *local_a8;
  char *pq;
  char *p_accept;
  char *altused;
  dynbuf req;
  char *httpstring;
  char *request;
  char *te;
  Curl_HttpReq httpreq;
  CURLcode result;
  connectdata *conn;
  _Bool *done_local;
  Curl_easy *data_local;
  
  _httpreq = data->conn;
  request = "";
  p_accept = (char *)0x0;
  *done = true;
  conn = (connectdata *)done;
  done_local = (_Bool *)data;
  if ((((_httpreq->alpn == '\x02') || (_httpreq->alpn != '\x03')) ||
      (((ulong)_httpreq->bits >> 4 & 1) == 0)) || (((ulong)_httpreq->bits >> 3 & 1) != 0)) {
    te._4_4_ = 0;
    te._4_4_ = Curl_headers_init(data);
    if (((te._4_4_ == CURLE_OK) &&
        (te._4_4_ = Curl_http_host((Curl_easy *)done_local,_httpreq), te._4_4_ == CURLE_OK)) &&
       (te._4_4_ = Curl_http_useragent((Curl_easy *)done_local), te._4_4_ == CURLE_OK)) {
      Curl_http_method((Curl_easy *)done_local,_httpreq,&httpstring,(Curl_HttpReq *)&te);
      local_a8 = (char *)0x0;
      if ((*(long *)(done_local + 0x1238) != 0) &&
         (local_a8 = curl_maprintf("%s?%s",*(undefined8 *)(done_local + 0x1230),
                                   *(undefined8 *)(done_local + 0x1238)), local_a8 == (char *)0x0))
      {
        return CURLE_OUT_OF_MEMORY;
      }
      if (local_a8 == (char *)0x0) {
        local_d0 = *(char **)(done_local + 0x1230);
      }
      else {
        local_d0 = local_a8;
      }
      te._4_4_ = Curl_http_output_auth
                           ((Curl_easy *)done_local,_httpreq,httpstring,(Curl_HttpReq)te,local_d0,
                            false);
      (*Curl_cfree)(local_a8);
      if (te._4_4_ == CURLE_OK) {
        (*Curl_cfree)(*(void **)(done_local + 0x1380));
        done_local[0x1380] = false;
        done_local[0x1381] = false;
        done_local[0x1382] = false;
        done_local[0x1383] = false;
        done_local[0x1384] = false;
        done_local[0x1385] = false;
        done_local[0x1386] = false;
        done_local[4999] = false;
        if ((*(long *)(done_local + 0x1248) != 0) &&
           (pcVar2 = Curl_checkheaders((Curl_easy *)done_local,"Referer",7), pcVar2 == (char *)0x0))
        {
          pcVar2 = curl_maprintf("Referer: %s\r\n",*(undefined8 *)(done_local + 0x1248));
          *(char **)(done_local + 0x1380) = pcVar2;
          if (*(long *)(done_local + 0x1380) == 0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        pcVar2 = Curl_checkheaders((Curl_easy *)done_local,"Accept-Encoding",0xf);
        if ((pcVar2 == (char *)0x0) && (*(long *)(done_local + 0x858) != 0)) {
          (*Curl_cfree)(*(void **)(done_local + 0x1368));
          done_local[0x1368] = false;
          done_local[0x1369] = false;
          done_local[0x136a] = false;
          done_local[0x136b] = false;
          done_local[0x136c] = false;
          done_local[0x136d] = false;
          done_local[0x136e] = false;
          done_local[0x136f] = false;
          pcVar2 = curl_maprintf("Accept-Encoding: %s\r\n",*(undefined8 *)(done_local + 0x858));
          *(char **)(done_local + 0x1368) = pcVar2;
          if (*(long *)(done_local + 0x1368) == 0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        else {
          (*Curl_cfree)(*(void **)(done_local + 0x1368));
          done_local[0x1368] = false;
          done_local[0x1369] = false;
          done_local[0x136a] = false;
          done_local[0x136b] = false;
          done_local[0x136c] = false;
          done_local[0x136d] = false;
          done_local[0x136e] = false;
          done_local[0x136f] = false;
        }
        te._4_4_ = Curl_transferencode((Curl_easy *)done_local);
        if ((te._4_4_ == CURLE_OK) &&
           (te._4_4_ = Curl_http_req_set_reader((Curl_easy *)done_local,(Curl_HttpReq)te,&request),
           te._4_4_ == CURLE_OK)) {
          pcVar2 = Curl_checkheaders((Curl_easy *)done_local,"Accept",6);
          local_130 = "Accept: */*\r\n";
          if (pcVar2 != (char *)0x0) {
            local_130 = (char *)0x0;
          }
          te._4_4_ = Curl_http_range((Curl_easy *)done_local,(Curl_HttpReq)te);
          if (te._4_4_ == CURLE_OK) {
            req.toobig = (size_t)get_http_string((Curl_easy *)done_local,_httpreq);
            Curl_dyn_init((dynbuf *)&altused,0x100000);
            Curl_dyn_reset((dynbuf *)(done_local + 0xc80));
            te._4_4_ = Curl_dyn_addf((dynbuf *)&altused,"%s ",httpstring);
            if (te._4_4_ == CURLE_OK) {
              te._4_4_ = Curl_http_target((Curl_easy *)done_local,_httpreq,(dynbuf *)&altused);
            }
            if (te._4_4_ == CURLE_OK) {
              if (((((ulong)_httpreq->bits >> 7 & 1) != 0) &&
                  (pcVar2 = Curl_checkheaders((Curl_easy *)done_local,"Alt-Used",8),
                  pcVar2 == (char *)0x0)) &&
                 (p_accept = curl_maprintf("Alt-Used: %s:%d\r\n",(_httpreq->conn_to_host).name,
                                           (ulong)(uint)_httpreq->conn_to_port),
                 p_accept == (char *)0x0)) {
                Curl_dyn_free((dynbuf *)&altused);
                return CURLE_OUT_OF_MEMORY;
              }
              sVar1 = req.toobig;
              if (*(long *)(done_local + 5000) == 0) {
                local_e0 = "";
              }
              else {
                local_e0 = *(char **)(done_local + 5000);
              }
              if (*(long *)(done_local + 0x13b8) == 0) {
                local_f0 = "";
              }
              else {
                local_f0 = *(char **)(done_local + 0x13b8);
              }
              if (*(long *)(done_local + 0x1370) == 0) {
                local_100 = "";
              }
              else {
                local_100 = *(char **)(done_local + 0x1370);
              }
              if (((*(uint *)(done_local + 0x13d4) >> 8 & 1) == 0) ||
                 (*(long *)(done_local + 0x1378) == 0)) {
                local_110 = "";
              }
              else {
                local_110 = *(char **)(done_local + 0x1378);
              }
              if (((*(long *)(done_local + 0x8a8) == 0) || (**(char **)(done_local + 0x8a8) == '\0')
                  ) || (*(long *)(done_local + 0x1360) == 0)) {
                local_120 = "";
              }
              else {
                local_120 = *(char **)(done_local + 0x1360);
              }
              if (local_130 == (char *)0x0) {
                local_130 = "";
              }
              if (*(long *)(done_local + 0x13a0) == 0) {
                local_140 = "";
              }
              else {
                local_140 = *(char **)(done_local + 0x13a0);
              }
              if (((*(long *)(done_local + 0x858) == 0) || (**(char **)(done_local + 0x858) == '\0')
                  ) || (*(long *)(done_local + 0x1368) == 0)) {
                local_150 = "";
              }
              else {
                local_150 = *(char **)(done_local + 0x1368);
              }
              if ((*(long *)(done_local + 0x1248) == 0) || (*(long *)(done_local + 0x1380) == 0)) {
                local_160 = "";
              }
              else {
                local_160 = *(char **)(done_local + 0x1380);
              }
              bVar3 = false;
              if ((((ulong)_httpreq->bits & 1) != 0) &&
                 (bVar3 = false, ((ulong)_httpreq->bits >> 3 & 1) == 0)) {
                pcVar2 = Curl_checkheaders((Curl_easy *)done_local,"Proxy-Connection",0x10);
                bVar3 = false;
                if (pcVar2 == (char *)0x0) {
                  pcVar2 = Curl_checkProxyheaders
                                     ((Curl_easy *)done_local,_httpreq,"Proxy-Connection",0x10);
                  bVar3 = pcVar2 == (char *)0x0;
                }
              }
              pcVar2 = "";
              if (bVar3) {
                pcVar2 = "Proxy-Connection: Keep-Alive\r\n";
              }
              if (p_accept == (char *)0x0) {
                local_188 = "";
              }
              else {
                local_188 = p_accept;
              }
              te._4_4_ = Curl_dyn_addf((dynbuf *)&altused," HTTP/%s\r\n%s%s%s%s%s%s%s%s%s%s%s%s",
                                       sVar1,local_e0,local_f0,local_100,local_110,local_120,
                                       local_130,local_140,local_150,local_160,pcVar2,request,
                                       local_188);
              (*Curl_cfree)(*(void **)(done_local + 0x1370));
              done_local[0x1370] = false;
              done_local[0x1371] = false;
              done_local[0x1372] = false;
              done_local[0x1373] = false;
              done_local[0x1374] = false;
              done_local[0x1375] = false;
              done_local[0x1376] = false;
              done_local[0x1377] = false;
              (*Curl_cfree)(*(void **)(done_local + 0x13b8));
              done_local[0x13b8] = false;
              done_local[0x13b9] = false;
              done_local[0x13ba] = false;
              done_local[0x13bb] = false;
              done_local[0x13bc] = false;
              done_local[0x13bd] = false;
              done_local[0x13be] = false;
              done_local[0x13bf] = false;
              (*Curl_cfree)(p_accept);
              if (te._4_4_ == CURLE_OK) {
                if ((((_httpreq->handler->flags & 1) == 0) && (_httpreq->httpversion < 0x14)) &&
                   (done_local[0x13d0] == true)) {
                  te._4_4_ = CURLE_UNSUPPORTED_PROTOCOL;
                  Curl_dyn_free((dynbuf *)&altused);
                  return te._4_4_;
                }
                te._4_4_ = Curl_http_cookies((Curl_easy *)done_local,_httpreq,(dynbuf *)&altused);
                if ((te._4_4_ == CURLE_OK) && ((_httpreq->handler->protocol & 0xc0000000) != 0)) {
                  te._4_4_ = Curl_ws_request((Curl_easy *)done_local,(dynbuf *)&altused);
                }
                if (te._4_4_ == CURLE_OK) {
                  te._4_4_ = Curl_add_timecondition((Curl_easy *)done_local,(dynbuf *)&altused);
                }
                if (te._4_4_ == CURLE_OK) {
                  te._4_4_ = Curl_add_custom_headers
                                       ((Curl_easy *)done_local,false,(dynbuf *)&altused);
                }
                if ((te._4_4_ == CURLE_OK) &&
                   (te._4_4_ = Curl_http_req_complete
                                         ((Curl_easy *)done_local,(dynbuf *)&altused,
                                          (Curl_HttpReq)te), te._4_4_ == CURLE_OK)) {
                  te._4_4_ = Curl_req_send((Curl_easy *)done_local,(dynbuf *)&altused);
                }
                Curl_dyn_free((dynbuf *)&altused);
                if (((te._4_4_ == CURLE_OK) && (0x13 < _httpreq->httpversion)) &&
                   ((*(uint *)(done_local + 0x1c9) >> 0xf & 1) != 0)) {
                  *(uint *)(done_local + 0x1c9) = *(uint *)(done_local + 0x1c9) & 0xffff7fff;
                }
              }
              else {
                Curl_dyn_free((dynbuf *)&altused);
              }
            }
            else {
              Curl_dyn_free((dynbuf *)&altused);
            }
          }
        }
      }
    }
  }
  else {
    te._4_4_ = CURLE_UNSUPPORTED_PROTOCOL;
  }
  if (te._4_4_ == CURLE_TOO_LARGE) {
    Curl_failf((Curl_easy *)done_local,"HTTP request too large");
  }
  return te._4_4_;
}

Assistant:

CURLcode Curl_http(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  CURLcode result = CURLE_OK;
  Curl_HttpReq httpreq;
  const char *te = ""; /* transfer-encoding */
  const char *request;
  const char *httpstring;
  struct dynbuf req;
  char *altused = NULL;
  const char *p_accept;      /* Accept: string */

  /* Always consider the DO phase done after this function call, even if there
     may be parts of the request that are not yet sent, since we can deal with
     the rest of the request in the PERFORM phase. */
  *done = TRUE;

  switch(conn->alpn) {
  case CURL_HTTP_VERSION_3:
    DEBUGASSERT(Curl_conn_is_http3(data, conn, FIRSTSOCKET));
    break;
  case CURL_HTTP_VERSION_2:
#ifndef CURL_DISABLE_PROXY
    if(!Curl_conn_is_http2(data, conn, FIRSTSOCKET) &&
       conn->bits.proxy && !conn->bits.tunnel_proxy
      ) {
      result = Curl_http2_switch(data, conn, FIRSTSOCKET);
      if(result)
        goto fail;
    }
    else
#endif
      DEBUGASSERT(Curl_conn_is_http2(data, conn, FIRSTSOCKET));
    break;
  case CURL_HTTP_VERSION_1_1:
    /* continue with HTTP/1.x when explicitly requested */
    break;
  default:
    /* Check if user wants to use HTTP/2 with clear TCP */
    if(Curl_http2_may_switch(data, conn, FIRSTSOCKET)) {
      DEBUGF(infof(data, "HTTP/2 over clean TCP"));
      result = Curl_http2_switch(data, conn, FIRSTSOCKET);
      if(result)
        goto fail;
    }
    break;
  }

  /* Add collecting of headers written to client. For a new connection,
   * we might have done that already, but reuse
   * or multiplex needs it here as well. */
  result = Curl_headers_init(data);
  if(result)
    goto fail;

  result = Curl_http_host(data, conn);
  if(result)
    goto fail;

  result = Curl_http_useragent(data);
  if(result)
    goto fail;

  Curl_http_method(data, conn, &request, &httpreq);

  /* setup the authentication headers */
  {
    char *pq = NULL;
    if(data->state.up.query) {
      pq = aprintf("%s?%s", data->state.up.path, data->state.up.query);
      if(!pq)
        return CURLE_OUT_OF_MEMORY;
    }
    result = Curl_http_output_auth(data, conn, request, httpreq,
                                   (pq ? pq : data->state.up.path), FALSE);
    free(pq);
    if(result)
      goto fail;
  }

  Curl_safefree(data->state.aptr.ref);
  if(data->state.referer && !Curl_checkheaders(data, STRCONST("Referer"))) {
    data->state.aptr.ref = aprintf("Referer: %s\r\n", data->state.referer);
    if(!data->state.aptr.ref)
      return CURLE_OUT_OF_MEMORY;
  }

  if(!Curl_checkheaders(data, STRCONST("Accept-Encoding")) &&
     data->set.str[STRING_ENCODING]) {
    Curl_safefree(data->state.aptr.accept_encoding);
    data->state.aptr.accept_encoding =
      aprintf("Accept-Encoding: %s\r\n", data->set.str[STRING_ENCODING]);
    if(!data->state.aptr.accept_encoding)
      return CURLE_OUT_OF_MEMORY;
  }
  else
    Curl_safefree(data->state.aptr.accept_encoding);

#ifdef HAVE_LIBZ
  /* we only consider transfer-encoding magic if libz support is built-in */
  result = Curl_transferencode(data);
  if(result)
    goto fail;
#endif

  result = Curl_http_req_set_reader(data, httpreq, &te);
  if(result)
    goto fail;

  p_accept = Curl_checkheaders(data,
                               STRCONST("Accept")) ? NULL : "Accept: */*\r\n";

  result = Curl_http_range(data, httpreq);
  if(result)
    goto fail;

  httpstring = get_http_string(data, conn);

  /* initialize a dynamic send-buffer */
  Curl_dyn_init(&req, DYN_HTTP_REQUEST);

  /* make sure the header buffer is reset - if there are leftovers from a
     previous transfer */
  Curl_dyn_reset(&data->state.headerb);

  /* add the main request stuff */
  /* GET/HEAD/POST/PUT */
  result = Curl_dyn_addf(&req, "%s ", request);
  if(!result)
    result = Curl_http_target(data, conn, &req);
  if(result) {
    Curl_dyn_free(&req);
    goto fail;
  }

#ifndef CURL_DISABLE_ALTSVC
  if(conn->bits.altused && !Curl_checkheaders(data, STRCONST("Alt-Used"))) {
    altused = aprintf("Alt-Used: %s:%d\r\n",
                      conn->conn_to_host.name, conn->conn_to_port);
    if(!altused) {
      Curl_dyn_free(&req);
      return CURLE_OUT_OF_MEMORY;
    }
  }
#endif
  result =
    Curl_dyn_addf(&req,
                  " HTTP/%s\r\n" /* HTTP version */
                  "%s" /* host */
                  "%s" /* proxyuserpwd */
                  "%s" /* userpwd */
                  "%s" /* range */
                  "%s" /* user agent */
                  "%s" /* accept */
                  "%s" /* TE: */
                  "%s" /* accept-encoding */
                  "%s" /* referer */
                  "%s" /* Proxy-Connection */
                  "%s" /* transfer-encoding */
                  "%s",/* Alt-Used */

                  httpstring,
                  (data->state.aptr.host ? data->state.aptr.host : ""),
#ifndef CURL_DISABLE_PROXY
                  data->state.aptr.proxyuserpwd ?
                  data->state.aptr.proxyuserpwd : "",
#else
                  "",
#endif
                  data->state.aptr.userpwd ? data->state.aptr.userpwd : "",
                  (data->state.use_range && data->state.aptr.rangeline) ?
                  data->state.aptr.rangeline : "",
                  (data->set.str[STRING_USERAGENT] &&
                   *data->set.str[STRING_USERAGENT] &&
                   data->state.aptr.uagent) ?
                  data->state.aptr.uagent : "",
                  p_accept ? p_accept : "",
                  data->state.aptr.te ? data->state.aptr.te : "",
                  (data->set.str[STRING_ENCODING] &&
                   *data->set.str[STRING_ENCODING] &&
                   data->state.aptr.accept_encoding) ?
                  data->state.aptr.accept_encoding : "",
                  (data->state.referer && data->state.aptr.ref) ?
                  data->state.aptr.ref : "" /* Referer: <data> */,
#ifndef CURL_DISABLE_PROXY
                  (conn->bits.httpproxy &&
                   !conn->bits.tunnel_proxy &&
                   !Curl_checkheaders(data, STRCONST("Proxy-Connection")) &&
                   !Curl_checkProxyheaders(data, conn,
                                           STRCONST("Proxy-Connection"))) ?
                  "Proxy-Connection: Keep-Alive\r\n":"",
#else
                  "",
#endif
                  te,
                  altused ? altused : ""
      );

  /* clear userpwd and proxyuserpwd to avoid reusing old credentials
   * from reused connections */
  Curl_safefree(data->state.aptr.userpwd);
#ifndef CURL_DISABLE_PROXY
  Curl_safefree(data->state.aptr.proxyuserpwd);
#endif
  free(altused);

  if(result) {
    Curl_dyn_free(&req);
    goto fail;
  }

  if(!(conn->handler->flags&PROTOPT_SSL) &&
     conn->httpversion < 20 &&
     (data->state.httpwant == CURL_HTTP_VERSION_2)) {
    /* append HTTP2 upgrade magic stuff to the HTTP request if it is not done
       over SSL */
    result = Curl_http2_request_upgrade(&req, data);
    if(result) {
      Curl_dyn_free(&req);
      return result;
    }
  }

  result = Curl_http_cookies(data, conn, &req);
#ifndef CURL_DISABLE_WEBSOCKETS
  if(!result && conn->handler->protocol&(CURLPROTO_WS|CURLPROTO_WSS))
    result = Curl_ws_request(data, &req);
#endif
  if(!result)
    result = Curl_add_timecondition(data, &req);
  if(!result)
    result = Curl_add_custom_headers(data, FALSE, &req);

  if(!result) {
    /* req_send takes ownership of the 'req' memory on success */
    result = Curl_http_req_complete(data, &req, httpreq);
    if(!result)
      result = Curl_req_send(data, &req);
  }
  Curl_dyn_free(&req);
  if(result)
    goto fail;

  if((conn->httpversion >= 20) && data->req.upload_chunky)
    /* upload_chunky was set above to set up the request in a chunky fashion,
       but is disabled here again to avoid that the chunked encoded version is
       actually used when sending the request body over h2 */
    data->req.upload_chunky = FALSE;
fail:
  if(CURLE_TOO_LARGE == result)
    failf(data, "HTTP request too large");
  return result;
}